

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# repeated_field.h
# Opt level: O2

void __thiscall
google::protobuf::RepeatedField<bool>::set_size(RepeatedField<bool> *this,bool is_soo,int size)

{
  Nullable<const_char_*> failure_msg;
  int v2;
  undefined7 in_register_00000031;
  LogMessageFatal LStack_28;
  
  if ((int)CONCAT71(in_register_00000031,is_soo) == 0) {
    v2 = (this->soo_rep_).field_0.long_rep.capacity;
  }
  else {
    v2 = 3;
  }
  failure_msg = absl::lts_20250127::log_internal::Check_LEImpl(size,v2,"size <= Capacity(is_soo)");
  if (failure_msg == (Nullable<const_char_*>)0x0) {
    internal::SooRep::set_size(&this->soo_rep_,is_soo,size);
    return;
  }
  absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
            (&LStack_28,
             "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/repeated_field.h"
             ,0x1ea,failure_msg);
  absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal(&LStack_28);
}

Assistant:

void set_size(bool is_soo, int size) {
    ABSL_DCHECK_LE(size, Capacity(is_soo));
    soo_rep_.set_size(is_soo, size);
  }